

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall ON_SimpleArray<double>::Append(ON_SimpleArray<double> *this,double *x)

{
  double dVar1;
  int iVar2;
  double *memblock;
  int iVar3;
  uint uVar4;
  
  iVar2 = this->m_count;
  memblock = x;
  if (iVar2 == this->m_capacity) {
    if (iVar2 < 8 || (ulong)((long)iVar2 * 8) < 0x10000001) {
      uVar4 = 4;
      if (2 < iVar2) {
        uVar4 = iVar2 * 2;
      }
    }
    else {
      iVar3 = 0x2000008;
      if (iVar2 < 0x2000008) {
        iVar3 = iVar2;
      }
      uVar4 = iVar3 + iVar2;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (double *)onmalloc(8);
      *memblock = *x;
    }
    if ((uint)this->m_capacity < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
    }
    if (this->m_a == (double *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  dVar1 = *memblock;
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  this->m_a[iVar2] = dVar1;
  if (memblock == x) {
    return;
  }
  onfree(memblock);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}